

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_casts.cpp
# Opt level: O1

bool duckdb::AggregateStateToBlobCast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  TypeMismatchException *this;
  string local_48;
  
  if ((result->type).id_ == BLOB) {
    Vector::Reinterpret(result,source);
    return true;
  }
  this = (TypeMismatchException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Cannot cast AGGREGATE_STATE to anything but BLOB","");
  TypeMismatchException::TypeMismatchException(this,&source->type,&result->type,&local_48);
  __cxa_throw(this,&TypeMismatchException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static bool AggregateStateToBlobCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	if (result.GetType().id() != LogicalTypeId::BLOB) {
		throw TypeMismatchException(source.GetType(), result.GetType(),
		                            "Cannot cast AGGREGATE_STATE to anything but BLOB");
	}
	result.Reinterpret(source);
	return true;
}